

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3TableAffinityStr(sqlite3 *db,Table *pTab)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  int local_28;
  int local_24;
  int j;
  int i;
  char *zColAff;
  Table *pTab_local;
  sqlite3 *db_local;
  
  pcVar2 = (char *)sqlite3DbMallocRaw(db,(long)(pTab->nCol + 1));
  if (pcVar2 != (char *)0x0) {
    local_28 = 0;
    for (local_24 = 0; local_24 < pTab->nCol; local_24 = local_24 + 1) {
      if ((pTab->aCol[local_24].colFlags & 0x20) == 0) {
        pcVar2[local_28] = pTab->aCol[local_24].affinity;
        local_28 = local_28 + 1;
      }
    }
    do {
      iVar3 = local_28 + -1;
      pcVar2[local_28] = '\0';
      bVar1 = false;
      if (-1 < iVar3) {
        bVar1 = pcVar2[iVar3] < 'B';
      }
      local_28 = iVar3;
    } while (bVar1);
  }
  return pcVar2;
}

Assistant:

SQLITE_PRIVATE char *sqlite3TableAffinityStr(sqlite3 *db, const Table *pTab){
  char *zColAff;
  zColAff = (char *)sqlite3DbMallocRaw(db, pTab->nCol+1);
  if( zColAff ){
    int i, j;
    for(i=j=0; i<pTab->nCol; i++){
      if( (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ){
        zColAff[j++] = pTab->aCol[i].affinity;
      }
    }
    do{
      zColAff[j--] = 0;
    }while( j>=0 && zColAff[j]<=SQLITE_AFF_BLOB );
  }
  return zColAff;
}